

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_bool32 ma_channel_map_is_blank(ma_channel *pChannelMap,ma_uint32 channels)

{
  ulong uVar1;
  
  if (pChannelMap == (ma_channel *)0x0) {
    return 0;
  }
  if (channels != 0) {
    uVar1 = 0;
    do {
      if (pChannelMap[uVar1] != '\0') {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (channels != uVar1);
  }
  return 1;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_blank(const ma_channel* pChannelMap, ma_uint32 channels)
{
    ma_uint32 iChannel;

    /* A null channel map is equivalent to the default channel map. */
    if (pChannelMap == NULL) {
        return MA_FALSE;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (pChannelMap[iChannel] != MA_CHANNEL_NONE) {
            return MA_FALSE;
        }
    }

    return MA_TRUE;
}